

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O1

SQRESULT sq_next(HSQUIRRELVM v,SQInteger idx)

{
  SQUnsignedInteger *pSVar1;
  bool bVar2;
  SQObjectPtr *pSVar3;
  SQRESULT SVar4;
  int faketojump;
  SQObjectPtr o;
  SQObjectPtr val;
  SQObjectPtr realkey;
  
  if (idx < 0) {
    pSVar3 = SQVM::GetUp(v,idx);
  }
  else {
    pSVar3 = SQVM::GetAt(v,idx + v->_stackbase + -1);
  }
  o.super_SQObject._type = (pSVar3->super_SQObject)._type;
  o.super_SQObject._unVal = (SQObjectValue)(pSVar3->super_SQObject)._unVal.pTable;
  if ((o.super_SQObject._type >> 0x1b & 1) != 0) {
    pSVar1 = &((o.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
              super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  pSVar3 = SQVM::GetUp(v,-1);
  realkey.super_SQObject._unVal.pTable = (SQTable *)0x0;
  realkey.super_SQObject._type = OT_NULL;
  val.super_SQObject._unVal.pTable = (SQTable *)0x0;
  val.super_SQObject._type = OT_NULL;
  if (o.super_SQObject._type == OT_GENERATOR) {
    SVar4 = -1;
    sq_throwerror(v,"cannot iterate a generator");
  }
  else {
    bVar2 = SQVM::FOREACH_OP(v,&o,&realkey,&val,pSVar3,0,0x29a,&faketojump);
    SVar4 = -1;
    if (bVar2 && faketojump != 0x29a) {
      SQVM::Push(v,&realkey);
      SQVM::Push(v,&val);
      SVar4 = 0;
    }
  }
  SQObjectPtr::~SQObjectPtr(&val);
  SQObjectPtr::~SQObjectPtr(&realkey);
  SQObjectPtr::~SQObjectPtr(&o);
  return SVar4;
}

Assistant:

SQRESULT sq_next(HSQUIRRELVM v,SQInteger idx)
{
    SQObjectPtr o=stack_get(v,idx),&refpos = stack_get(v,-1),realkey,val;
    if(type(o) == OT_GENERATOR) {
        return sq_throwerror(v,_SC("cannot iterate a generator"));
    }
    int faketojump;
    if(!v->FOREACH_OP(o,realkey,val,refpos,0,666,faketojump))
        return SQ_ERROR;
    if(faketojump != 666) {
        v->Push(realkey);
        v->Push(val);
        return SQ_OK;
    }
    return SQ_ERROR;
}